

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_seckey_tweak_add(secp256k1_context *ctx,uchar *seckey,uchar *tweak)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  int overflow;
  int local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (seckey == (uchar *)0x0) {
    secp256k1_ec_seckey_tweak_add_cold_2();
  }
  else {
    if (tweak != (uchar *)0x0) {
      secp256k1_scalar_set_b32((secp256k1_scalar *)local_58,seckey,&local_5c);
      uVar1 = local_58._0_8_;
      uVar2 = local_58._8_8_;
      uVar3 = local_48._0_8_;
      uVar4 = local_48._8_8_;
      uVar5 = secp256k1_ec_seckey_tweak_add_helper((secp256k1_scalar *)local_58,tweak);
      if ((uVar2 == 0 && uVar4 == 0) && (uVar1 == 0 && uVar3 == 0)) {
        uVar5 = 0;
      }
      if (local_5c != 0) {
        uVar5 = 0;
      }
      lVar6 = (ulong)(uVar5 ^ 1) - 1;
      auVar7._8_4_ = (int)lVar6;
      auVar7._0_8_ = lVar6;
      auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
      local_58 = local_58 & auVar7;
      local_48 = auVar7 & local_48;
      secp256k1_scalar_get_b32(seckey,(secp256k1_scalar *)local_58);
      return uVar5;
    }
    secp256k1_ec_seckey_tweak_add_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_add(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= secp256k1_ec_seckey_tweak_add_helper(&sec, tweak);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}